

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sim.cc
# Opt level: O0

void __thiscall sim_slicing_bit_Test::TestBody(sim_slicing_bit_Test *this)

{
  initializer_list<std::pair<unsigned_int,_unsigned_int>_> __l;
  initializer_list<unsigned_int> __l_00;
  initializer_list<std::pair<unsigned_int,_unsigned_int>_> __l_01;
  bool bVar1;
  Generator *pGVar2;
  Var *pVVar3;
  type_conflict *lhs;
  char *pcVar4;
  AssertHelper local_368;
  Message local_360;
  int local_354;
  undefined1 local_350 [8];
  AssertionResult gtest_ar_3;
  Message local_338;
  int local_32c;
  undefined1 local_328 [8];
  AssertionResult gtest_ar_2;
  allocator<std::pair<unsigned_int,_unsigned_int>_> local_301;
  int local_300 [4];
  pair<unsigned_int,_unsigned_int> local_2f0;
  pair<unsigned_int,_unsigned_int> local_2e8;
  iterator local_2e0;
  size_type local_2d8;
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  local_2d0;
  pair<unsigned_int,_unsigned_int> local_2b4;
  allocator<unsigned_int> local_2a9;
  uint local_2a8 [2];
  iterator local_2a0;
  size_type local_298;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_290;
  allocator<char> local_271;
  string local_270;
  Var *local_250;
  Var *b;
  Message local_240;
  int local_234;
  undefined1 local_230 [8];
  AssertionResult gtest_ar_1;
  Message local_218;
  int local_20c;
  undefined1 local_208 [8];
  AssertionResult gtest_ar;
  type_conflict *low;
  type_conflict *high;
  int local_1e0 [2];
  pair<unsigned_int,_unsigned_int> local_1d8;
  iterator local_1d0;
  size_type local_1c8;
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  local_1c0;
  pair<unsigned_int,_unsigned_int> local_1a4;
  allocator<char> local_199;
  string local_198;
  Var *local_178;
  Var *a;
  allocator<char> local_159;
  string local_158;
  Generator *local_138;
  Generator *mod;
  Context context;
  sim_slicing_bit_Test *this_local;
  
  context.tracked_generators_._M_h._M_single_bucket = (__node_base_ptr)this;
  kratos::Context::Context((Context *)&mod);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_158,"mod",&local_159);
  pGVar2 = kratos::Context::generator((Context *)&mod,&local_158);
  std::__cxx11::string::~string((string *)&local_158);
  std::allocator<char>::~allocator(&local_159);
  local_138 = pGVar2;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_198,"a",&local_199);
  pVVar3 = kratos::Generator::var(pGVar2,&local_198,3);
  std::__cxx11::string::~string((string *)&local_198);
  std::allocator<char>::~allocator(&local_199);
  local_1e0[1] = 1;
  local_1e0[0] = 1;
  local_178 = pVVar3;
  std::pair<unsigned_int,_unsigned_int>::pair<int,_int,_true>(&local_1d8,local_1e0 + 1,local_1e0);
  local_1d0 = &local_1d8;
  local_1c8 = 1;
  std::allocator<std::pair<unsigned_int,_unsigned_int>_>::allocator
            ((allocator<std::pair<unsigned_int,_unsigned_int>_> *)((long)&high + 7));
  __l_01._M_len = local_1c8;
  __l_01._M_array = local_1d0;
  std::
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ::vector(&local_1c0,__l_01,(allocator<std::pair<unsigned_int,_unsigned_int>_> *)((long)&high + 7))
  ;
  local_1a4 = kratos::compute_var_high_low(pVVar3,&local_1c0);
  std::
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ::~vector(&local_1c0);
  std::allocator<std::pair<unsigned_int,_unsigned_int>_>::~allocator
            ((allocator<std::pair<unsigned_int,_unsigned_int>_> *)((long)&high + 7));
  lhs = std::get<0ul,unsigned_int,unsigned_int>(&local_1a4);
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )std::get<1ul,unsigned_int,unsigned_int>(&local_1a4);
  local_20c = 1;
  testing::internal::EqHelper::Compare<unsigned_int,_int,_nullptr>
            ((EqHelper *)local_208,"high","1",lhs,&local_20c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_208);
  if (!bVar1) {
    testing::Message::Message(&local_218);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_208);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/tests/test_sim.cc",
               0xf,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_218);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_218);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_208);
  local_234 = 1;
  testing::internal::EqHelper::Compare<unsigned_int,_int,_nullptr>
            ((EqHelper *)local_230,"low","1",
             (uint *)gtest_ar.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                     ._M_head_impl,&local_234);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_230);
  if (!bVar1) {
    testing::Message::Message(&local_240);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_230);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&b,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/tests/test_sim.cc",
               0x10,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&b,&local_240);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&b);
    testing::Message::~Message(&local_240);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_230);
  pGVar2 = local_138;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_270,"b",&local_271);
  local_2a8[0] = 2;
  local_2a8[1] = 2;
  local_2a0 = local_2a8;
  local_298 = 2;
  std::allocator<unsigned_int>::allocator(&local_2a9);
  __l_00._M_len = local_298;
  __l_00._M_array = local_2a0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_290,__l_00,&local_2a9);
  pVVar3 = kratos::Generator::var(pGVar2,&local_270,4,&local_290);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_290);
  std::allocator<unsigned_int>::~allocator(&local_2a9);
  std::__cxx11::string::~string((string *)&local_270);
  std::allocator<char>::~allocator(&local_271);
  local_300[3] = 1;
  local_300[2] = 1;
  local_250 = pVVar3;
  std::pair<unsigned_int,_unsigned_int>::pair<int,_int,_true>
            (&local_2f0,local_300 + 3,local_300 + 2);
  local_300[1] = 1;
  local_300[0] = 1;
  std::pair<unsigned_int,_unsigned_int>::pair<int,_int,_true>(&local_2e8,local_300 + 1,local_300);
  local_2e0 = &local_2f0;
  local_2d8 = 2;
  std::allocator<std::pair<unsigned_int,_unsigned_int>_>::allocator(&local_301);
  __l._M_len = local_2d8;
  __l._M_array = local_2e0;
  std::
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ::vector(&local_2d0,__l,&local_301);
  local_2b4 = kratos::compute_var_high_low(pVVar3,&local_2d0);
  std::tie<unsigned_int,unsigned_int>((uint *)&gtest_ar_2.message_,lhs);
  std::tuple<unsigned_int&,unsigned_int&>::operator=
            ((tuple<unsigned_int&,unsigned_int&> *)&gtest_ar_2.message_,&local_2b4);
  std::
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ::~vector(&local_2d0);
  std::allocator<std::pair<unsigned_int,_unsigned_int>_>::~allocator(&local_301);
  local_32c = 0xf;
  testing::internal::EqHelper::Compare<unsigned_int,_int,_nullptr>
            ((EqHelper *)local_328,"high","4 * 4 - 1",lhs,&local_32c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_328);
  if (!bVar1) {
    testing::Message::Message(&local_338);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_328);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/tests/test_sim.cc",
               0x13,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_338);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_338);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_328);
  local_354 = 0xc;
  testing::internal::EqHelper::Compare<unsigned_int,_int,_nullptr>
            ((EqHelper *)local_350,"low","4 * 3",
             (uint *)gtest_ar.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                     ._M_head_impl,&local_354);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_350);
  if (!bVar1) {
    testing::Message::Message(&local_360);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_350);
    testing::internal::AssertHelper::AssertHelper
              (&local_368,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/tests/test_sim.cc",
               0x14,pcVar4);
    testing::internal::AssertHelper::operator=(&local_368,&local_360);
    testing::internal::AssertHelper::~AssertHelper(&local_368);
    testing::Message::~Message(&local_360);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_350);
  kratos::Context::~Context((Context *)&mod);
  return;
}

Assistant:

TEST(sim, slicing_bit) {  // NOLINT
    Context context;
    auto &mod = context.generator("mod");
    auto &a = mod.var("a", 3);
    auto [high, low] = compute_var_high_low(&a, {{1, 1}});
    EXPECT_EQ(high, 1);
    EXPECT_EQ(low, 1);
    auto &b = mod.var("b", 4, {2, 2});
    std::tie(high, low) = compute_var_high_low(&b, {{1, 1}, {1, 1}});
    EXPECT_EQ(high, 4 * 4 - 1);
    EXPECT_EQ(low, 4 * 3);
}